

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

string * __thiscall inja::Token::describe_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Kind KVar1;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  Token *local_18;
  Token *this_local;
  
  KVar1 = this->kind;
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  if (KVar1 == Text) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<text>",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (KVar1 == LineStatementClose) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<eol>",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (KVar1 == Eof) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<eof>",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else {
    nonstd::sv_lite::basic_string_view::operator_cast_to_string
              (__return_storage_ptr__,(basic_string_view *)&this->text);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const {
		switch (kind) {
			case Kind::Text:
				return "<text>";
			case Kind::LineStatementClose:
				return "<eol>";
			case Kind::Eof:
				return "<eof>";
			default:
				return static_cast<std::string>(text);
		}
	}